

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::fragment_sections::key(fragment_sections *this,string *s)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>
  *this_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>
  __l;
  bool bVar1;
  int iVar2;
  pointer pvVar3;
  error_code eVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  *local_390;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_true>
  local_378;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_true>
  local_370;
  const_iterator pos;
  key_equal local_360;
  hasher local_35f;
  section_kind local_35e [37];
  section_kind local_339;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  *local_338;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_308;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_2e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_2b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_290;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_268;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_240;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_218;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_1c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_178;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_150;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_100;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_60;
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  string *s_local;
  fragment_sections *this_local;
  error_category *local_10;
  
  local_28 = (undefined1  [8])s;
  s_local = (string *)this;
  if ((key(std::__cxx11::string_const&)::map_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&key(std::__cxx11::string_const&)::map_abi_cxx11_), iVar2 != 0)) {
    local_338 = &local_330;
    local_339 = text;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[5],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [5])0x2f42ca,&local_339);
    local_338 = &local_308;
    local_35e[0x11] = 1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[5],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [5])0x2fe7e8,local_35e + 0x11);
    local_338 = &local_2e0;
    local_35e[0x10] = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[4],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [4])0x2ed68a,local_35e + 0x10);
    local_338 = &local_2b8;
    local_35e[0xf] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[7],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [7])"rel_ro",local_35e + 0xf);
    local_338 = &local_290;
    local_35e[0xe] = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[26],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [26])"mergeable_1_byte_c_string",local_35e + 0xe);
    local_338 = &local_268;
    local_35e[0xd] = 5;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[26],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [26])"mergeable_2_byte_c_string",local_35e + 0xd);
    local_338 = &local_240;
    local_35e[0xc] = 6;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[26],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [26])"mergeable_4_byte_c_string",local_35e + 0xc);
    local_338 = &local_218;
    local_35e[0xb] = 7;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[18],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [18])"mergeable_const_4",local_35e + 0xb);
    local_338 = &local_1f0;
    local_35e[10] = 8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[18],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [18])"mergeable_const_8",local_35e + 10);
    local_338 = &local_1c8;
    local_35e[9] = 9;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[19],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [19])"mergeable_const_16",local_35e + 9);
    local_338 = &local_1a0;
    local_35e[8] = 10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[19],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [19])"mergeable_const_32",local_35e + 8);
    local_338 = &local_178;
    local_35e[7] = 0xb;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[10],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [10])"read_only",local_35e + 7);
    local_338 = &local_150;
    local_35e[6] = 0xc;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[12],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [12])"thread_data",local_35e + 6);
    local_338 = &local_128;
    local_35e[5] = 0xd;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[11],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [11])"thread_bss",local_35e + 5);
    local_338 = &local_100;
    local_35e[4] = 0xe;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[11],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [11])0x2febdc,local_35e + 4);
    local_338 = &local_d8;
    local_35e[3] = 0xf;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[10],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [10])"debug_loc",local_35e + 3);
    local_338 = &local_b0;
    local_35e[2] = 0x10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[13],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [13])"debug_string",local_35e + 2);
    local_338 = &local_88;
    local_35e[1] = 0x11;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[13],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [13])"debug_ranges",local_35e + 1);
    local_338 = &local_60;
    local_35e[0] = linked_definitions;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[19],_pstore::repo::section_kind,_true>
              (local_338,(char (*) [19])"linked_definitions",local_35e);
    local_38 = &local_330;
    local_30 = 0x13;
    this_00 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>
               *)((long)&pos.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_true>
                         ._M_cur + 7);
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>
    ::allocator(this_00);
    __l._M_len = local_30;
    __l._M_array = local_38;
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>_>
    ::unordered_map(&key(std::__cxx11::string_const&)::map_abi_cxx11_,__l,0,&local_35f,&local_360,
                    this_00);
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>
    ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>
                  *)((long)&pos.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_true>
                            ._M_cur + 7));
    local_390 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
                 *)&local_38;
    do {
      local_390 = local_390 + -1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::~pair(local_390);
    } while (local_390 != &local_330);
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>_>
                 ::~unordered_map,&key(std::__cxx11::string_const&)::map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&key(std::__cxx11::string_const&)::map_abi_cxx11_);
  }
  local_370._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>_>
       ::find(&key(std::__cxx11::string_const&)::map_abi_cxx11_,(key_type *)local_28);
  local_378._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>_>
       ::end(&key(std::__cxx11::string_const&)::map_abi_cxx11_);
  bVar1 = std::__detail::operator==(&local_370,&local_378);
  if (bVar1) {
    std::error_code::error_code<pstore::exchange::import_ns::error,void>
              ((error_code *)&this_local,unknown_section_name);
  }
  else {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_false,_true>
                           *)&local_370);
    switch(pvVar3->second) {
    case text:
      eVar4 = create_section_importer<(pstore::repo::section_kind)0>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case data:
      eVar4 = create_section_importer<(pstore::repo::section_kind)1>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case bss:
      eVar4 = create_section_importer<(pstore::repo::section_kind)2>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case rel_ro:
      eVar4 = create_section_importer<(pstore::repo::section_kind)3>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case mergeable_1_byte_c_string:
      eVar4 = create_section_importer<(pstore::repo::section_kind)4>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case mergeable_2_byte_c_string:
      eVar4 = create_section_importer<(pstore::repo::section_kind)5>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case mergeable_4_byte_c_string:
      eVar4 = create_section_importer<(pstore::repo::section_kind)6>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case mergeable_const_4:
      eVar4 = create_section_importer<(pstore::repo::section_kind)7>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case mergeable_const_8:
      eVar4 = create_section_importer<(pstore::repo::section_kind)8>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case mergeable_const_16:
      eVar4 = create_section_importer<(pstore::repo::section_kind)9>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case mergeable_const_32:
      eVar4 = create_section_importer<(pstore::repo::section_kind)10>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case read_only:
      eVar4 = create_section_importer<(pstore::repo::section_kind)11>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case thread_data:
      eVar4 = create_section_importer<(pstore::repo::section_kind)12>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case thread_bss:
      eVar4 = create_section_importer<(pstore::repo::section_kind)13>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case debug_line:
      eVar4 = create_section_importer<(pstore::repo::section_kind)14>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case debug_loc:
      eVar4 = create_section_importer<(pstore::repo::section_kind)15>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case debug_string:
      eVar4 = create_section_importer<(pstore::repo::section_kind)16>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case debug_ranges:
      eVar4 = create_section_importer<(pstore::repo::section_kind)17>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case linked_definitions:
      eVar4 = create_section_importer<(pstore::repo::section_kind)18>(this);
      local_10 = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      break;
    case last:
      assert_failed("false && \"Illegal section kind\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/import_fragment.cpp"
                    ,0x86);
    default:
      std::error_code::error_code<pstore::exchange::import_ns::error,void>
                ((error_code *)&this_local,unknown_section_name);
    }
  }
  eVar4._4_4_ = 0;
  eVar4._M_value = (uint)this_local;
  eVar4._M_cat = local_10;
  return eVar4;
}

Assistant:

std::error_code fragment_sections::key (std::string const & s) {
                using repo::section_kind;

#define X(a) {#a, section_kind::a},
                static std::unordered_map<std::string, section_kind> const map{
                    PSTORE_MCREPO_SECTION_KINDS};
#undef X
                auto const pos = map.find (s);
                if (pos == map.end ()) {
                    return error::unknown_section_name;
                }

#define X(a)                                                                                       \
    case section_kind::a: return this->create_section_importer<section_kind::a> ();
                switch (pos->second) {
                    PSTORE_MCREPO_SECTION_KINDS
                case section_kind::last:
                    PSTORE_ASSERT (false && "Illegal section kind"); // unreachable
                }
#undef X
                return error::unknown_section_name;
            }